

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O3

Cba_Man_t *
Cba_ManAlloc(char *pFileName,int nNtks,Abc_Nam_t *pStrs,Abc_Nam_t *pFuns,Abc_Nam_t *pMods,
            Hash_IntMan_t *vHash)

{
  uint uVar1;
  Cba_Man_t *pCVar2;
  char *pcVar3;
  size_t sVar4;
  Abc_Nam_t *p;
  Vec_Int_t *pVVar5;
  int *piVar6;
  void **ppvVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  
  pCVar2 = (Cba_Man_t *)calloc(1,0x658);
  pcVar3 = Extra_FileDesignName(pFileName);
  pCVar2->pName = pcVar3;
  if (pFileName == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pFileName);
    pcVar3 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar3,pFileName);
  }
  pCVar2->pSpec = pcVar3;
  if (pStrs == (Abc_Nam_t *)0x0) {
    pStrs = Abc_NamStart(1000,0x18);
  }
  pCVar2->pStrs = pStrs;
  p = pFuns;
  if (pFuns == (Abc_Nam_t *)0x0) {
    p = Abc_NamStart(100,0x18);
  }
  pCVar2->pFuns = p;
  if (pMods == (Abc_Nam_t *)0x0) {
    pMods = Abc_NamStart(100,0x18);
  }
  pCVar2->pMods = pMods;
  if (vHash == (Hash_IntMan_t *)0x0) {
    vHash = (Hash_IntMan_t *)calloc(1,0x18);
    uVar10 = 1099;
    while( true ) {
      do {
        uVar9 = uVar10;
        uVar10 = uVar9 + 1;
      } while ((uVar9 & 1) != 0);
      if (uVar10 < 9) break;
      iVar8 = 5;
      while( true ) {
        if (uVar10 % (iVar8 - 2U) == 0) break;
        uVar1 = iVar8 * iVar8;
        iVar8 = iVar8 + 2;
        if (uVar10 < uVar1) goto LAB_00337188;
      }
    }
LAB_00337188:
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    uVar1 = 0x10;
    if (0xe < uVar9) {
      uVar1 = uVar10;
    }
    pVVar5->nCap = uVar1;
    piVar6 = (int *)malloc((long)(int)uVar1 << 2);
    pVVar5->pArray = piVar6;
    pVVar5->nSize = uVar10;
    memset(piVar6,0,(long)(int)uVar10 << 2);
    vHash->vTable = pVVar5;
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    pVVar5->nCap = 0x1130;
    piVar6 = (int *)malloc(0x44c0);
    pVVar5->pArray = piVar6;
    vHash->vObjs = pVVar5;
    piVar6[0] = 0;
    piVar6[1] = 0;
    piVar6[2] = 0;
    piVar6[3] = 0;
    pVVar5->nSize = 4;
    vHash->nRefs = 1;
  }
  pCVar2->vHash = vHash;
  if (pFuns == (Abc_Nam_t *)0x0) {
    Abc_NamStrFindOrAdd(p,"1\'b0",(int *)0x0);
    Abc_NamStrFindOrAdd(p,"1\'b1",(int *)0x0);
    Abc_NamStrFindOrAdd(p,"1\'bx",(int *)0x0);
    Abc_NamStrFindOrAdd(p,"1\'bz",(int *)0x0);
  }
  if (nNtks < 0) {
    ppvVar7 = (void **)malloc(0x80);
    iVar8 = 0x10;
  }
  else {
    iVar8 = nNtks + 1;
    ppvVar7 = (void **)malloc((ulong)(uint)nNtks * 8 + 8);
  }
  (pCVar2->vNtks).pArray = ppvVar7;
  (pCVar2->vNtks).nCap = iVar8;
  (pCVar2->vNtks).nSize = 1;
  *ppvVar7 = (void *)0x0;
  pCVar2->iRoot = 1;
  return pCVar2;
}

Assistant:

static inline Cba_Man_t * Cba_ManAlloc( char * pFileName, int nNtks, Abc_Nam_t * pStrs, Abc_Nam_t * pFuns, Abc_Nam_t * pMods, Hash_IntMan_t * vHash )
{
    Cba_Man_t * pNew = ABC_CALLOC( Cba_Man_t, 1 );
    pNew->pName = Extra_FileDesignName( pFileName );
    pNew->pSpec = Abc_UtilStrsav( pFileName );
    pNew->pStrs = pStrs ? pStrs : Abc_NamStart( 1000, 24 );
    pNew->pFuns = pFuns ? pFuns : Abc_NamStart( 100, 24 );
    pNew->pMods = pMods ? pMods : Abc_NamStart( 100, 24 );
    pNew->vHash = vHash ? vHash : Hash_IntManStart( 1000 );
    if ( pFuns == NULL )
    {
        Abc_NamStrFindOrAdd(pNew->pFuns, "1\'b0", NULL);
        Abc_NamStrFindOrAdd(pNew->pFuns, "1\'b1", NULL);
        Abc_NamStrFindOrAdd(pNew->pFuns, "1\'bx", NULL);
        Abc_NamStrFindOrAdd(pNew->pFuns, "1\'bz", NULL);
    }
//    if ( vHash == NULL )
//        Hash_Int2ManInsert( pNew->vHash, 0, 0, 0 );
    Vec_PtrGrow( &pNew->vNtks,  nNtks+1 ); Vec_PtrPush( &pNew->vNtks, NULL );
    // set default root module
    pNew->iRoot = 1;
    return pNew;
}